

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
booster::locale::basic_format<wchar_t>::add(basic_format<wchar_t> *this,formattible_type *param)

{
  ulong uVar1;
  
  uVar1 = (ulong)this->parameters_count_;
  if (uVar1 < 8) {
    if (this->parameters_ + uVar1 != param) {
      this->parameters_[uVar1].pointer_ = param->pointer_;
      this->parameters_[uVar1].writer_ = param->writer_;
    }
  }
  else {
    std::
    vector<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
    ::push_back(&this->ext_params_,param);
  }
  this->parameters_count_ = this->parameters_count_ + 1;
  return;
}

Assistant:

void add(formattible_type const &param)
            {
                if(parameters_count_ >= base_params_)
                    ext_params_.push_back(param);
                else 
                    parameters_[parameters_count_] = param;
                parameters_count_++;
            }